

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitInstructionImpl
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst,size_t inst_byte_offset,
          uint32_t block_indent,bool is_in_block)

{
  uint32_t *__k;
  ulong uVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  uint uVar5;
  ostream *poVar6;
  char *pcVar7;
  size_type sVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint32_t length;
  int iVar12;
  initializer_list<unsigned_int> __l;
  undefined8 local_380;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined1 local_370 [16];
  long local_360;
  ulong local_358;
  ostringstream comments;
  int local_338;
  char local_330 [8];
  undefined4 auStack_328 [50];
  undefined1 auStack_260 [152];
  string local_1c8 [32];
  ostringstream line;
  ulong auStack_198 [45];
  
  uVar2 = inst->opcode;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
  if ((uVar2 == 0xf8 & this->nested_indent_) == 1) {
    std::endl<char,std::char_traits<char>>(this->stream_);
  }
  __k = &inst->result_id;
  if (inst->result_id == 0) {
    _comments = local_330;
    std::__cxx11::string::_M_construct((ulong)&comments,(char)this->indent_);
    std::operator<<((ostream *)&line,(string *)&comments);
  }
  else {
    SetBlue(this);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comments,
                 &this->name_mapper_,*__k);
    if (this->indent_ != 0) {
      uVar5 = (this->indent_ - local_338) - 3;
      uVar10 = 0;
      if (0 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      *(ulong *)((long)auStack_198 + *(long *)(_line + -0x18)) = uVar10;
    }
    poVar6 = std::operator<<((ostream *)&line,"%");
    std::operator<<(poVar6,(string *)&comments);
    ResetColor(this);
    std::operator<<((ostream *)&line," = ");
  }
  std::__cxx11::string::_M_dispose();
  if ((is_in_block & this->nested_indent_) == 1) {
    _comments = local_330;
    std::__cxx11::string::_M_construct
              ((ulong)&comments,(char)block_indent * '\x02' + (uVar2 != 0xf8) * '\x02');
    std::operator<<((ostream *)&line,(string *)&comments);
    std::__cxx11::string::_M_dispose();
  }
  poVar6 = std::operator<<((ostream *)&line,"Op");
  pcVar7 = spvOpcodeString((uint)uVar2);
  std::operator<<(poVar6,pcVar7);
  lVar11 = 4;
  for (uVar10 = 0; uVar10 < inst->num_operands; uVar10 = uVar10 + 1) {
    iVar12 = *(int *)((long)&inst->operands->offset + lVar11);
    if (iVar12 != 3) {
      if (iVar12 == 0) {
        __assert_fail("type != SPV_OPERAND_TYPE_NONE",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                      ,0x2d6,
                      "void spvtools::disassemble::InstructionDisassembler::EmitInstructionImpl(const spv_parsed_instruction_t &, size_t, uint32_t, bool)"
                     );
      }
      std::operator<<((ostream *)&line," ");
      EmitOperand(this,(ostream *)&line,inst,(uint16_t)uVar10);
    }
    lVar11 = lVar11 + 0x10;
  }
  if (this->comment_ != 0) {
    GenerateCommentForDecoratedId(this,inst);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comments);
  if (this->show_byte_offset_ == true) {
    SetGrey(this,(ostream *)&comments);
    uVar3 = *(undefined4 *)((long)auStack_328 + *(long *)(_comments + -0x18));
    uVar4 = std::ios::fill();
    poVar6 = std::operator<<((ostream *)&comments,"");
    poVar6 = std::operator<<(poVar6,"0x");
    lVar11 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 8;
    lVar11 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar6 + lVar11 + 0x18) = *(uint *)(poVar6 + lVar11 + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::operator<<(poVar6,0x30);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(undefined4 *)((long)auStack_328 + *(long *)(_comments + -0x18)) = uVar3;
    lVar11 = *(long *)(_comments + -0x18);
    std::ios::fill();
    auStack_260[lVar11] = uVar4;
    ResetColor(this,(ostream *)&comments);
    pcVar7 = ", ";
  }
  else {
    pcVar7 = "";
  }
  iVar12 = this->comment_;
  if (uVar2 == 5 && iVar12 != 0) {
    poVar6 = std::operator<<((ostream *)&comments,pcVar7);
    poVar6 = std::operator<<(poVar6,"id %");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    iVar12 = this->comment_;
    pcVar7 = ", ";
  }
  if ((iVar12 != 0) && (*__k != 0)) {
    sVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->id_comments_)._M_h,__k);
    if (sVar8 != 0) {
      poVar6 = std::operator<<((ostream *)&comments,pcVar7);
      std::__detail::
      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->id_comments_,__k);
      std::__cxx11::stringbuf::str();
      std::operator<<(poVar6,(string *)&local_380);
      std::__cxx11::string::_M_dispose();
    }
  }
  poVar6 = this->stream_;
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar6,(string *)&local_380);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  lVar11 = CONCAT44(uStack_374,local_378);
  std::__cxx11::string::_M_dispose();
  if (lVar11 == 0) {
    this->last_instruction_comment_alignment_ = 0;
  }
  else {
    std::__cxx11::stringbuf::str();
    iVar12 = 0;
    uVar10 = 0;
    while (uVar10 < local_358) {
      if (*(char *)(local_360 + uVar10) == '\x1b') {
        do {
          uVar1 = uVar10 + 1;
          uVar9 = local_358;
          if (local_358 <= uVar1) break;
          pcVar7 = (char *)(local_360 + 1 + uVar10);
          uVar9 = uVar1;
          uVar10 = uVar1;
        } while (*pcVar7 != 'm');
      }
      else {
        iVar12 = iVar12 + 1;
        uVar9 = uVar10;
      }
      uVar10 = uVar9 + 1;
    }
    std::__cxx11::string::_M_dispose();
    local_380 = (undefined1 *)CONCAT44(this->last_instruction_comment_alignment_,iVar12 + 2);
    local_378 = 0x32;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_380;
    uVar5 = std::max<unsigned_int>(__l);
    uVar5 = uVar5 + 3 & 0xfffffffc;
    this->last_instruction_comment_alignment_ = uVar5;
    poVar6 = this->stream_;
    local_380 = local_370;
    std::__cxx11::string::_M_construct((ulong)&local_380,(char)uVar5 - (char)iVar12);
    poVar6 = std::operator<<(poVar6,(string *)&local_380);
    poVar6 = std::operator<<(poVar6,"; ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar6,local_1c8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::operator<<(this->stream_,"\n");
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comments);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
  return;
}

Assistant:

void InstructionDisassembler::EmitInstructionImpl(
    const spv_parsed_instruction_t& inst, size_t inst_byte_offset,
    uint32_t block_indent, bool is_in_block) {
  auto opcode = static_cast<spv::Op>(inst.opcode);

  // To better align the comments (if any), write the instruction to a line
  // first so its length can be readily available.
  std::ostringstream line;

  if (nested_indent_ && opcode == spv::Op::OpLabel) {
    // Separate the blocks by an empty line to make them easier to separate
    stream_ << std::endl;
  }

  if (inst.result_id) {
    SetBlue();
    const std::string id_name = name_mapper_(inst.result_id);
    if (indent_)
      line << std::setw(std::max(0, indent_ - 3 - int(id_name.size())));
    line << "%" << id_name;
    ResetColor();
    line << " = ";
  } else {
    line << std::string(indent_, ' ');
  }

  if (nested_indent_ && is_in_block) {
    // Output OpLabel at the specified nest level, and instructions inside
    // blocks nested a little more.
    uint32_t indent = block_indent;
    bool body_indent = opcode != spv::Op::OpLabel;

    line << std::string(
        indent * kBlockNestIndent + (body_indent ? kBlockBodyIndentOffset : 0),
        ' ');
  }

  line << "Op" << spvOpcodeString(opcode);

  for (uint16_t i = 0; i < inst.num_operands; i++) {
    const spv_operand_type_t type = inst.operands[i].type;
    assert(type != SPV_OPERAND_TYPE_NONE);
    if (type == SPV_OPERAND_TYPE_RESULT_ID) continue;
    line << " ";
    EmitOperand(line, inst, i);
  }

  // For the sake of comment generation, store information from some
  // instructions for the future.
  if (comment_) {
    GenerateCommentForDecoratedId(inst);
  }

  std::ostringstream comments;
  const char* comment_separator = "";

  if (show_byte_offset_) {
    SetGrey(comments);
    auto saved_flags = comments.flags();
    auto saved_fill = comments.fill();
    comments << comment_separator << "0x" << std::setw(8) << std::hex
             << std::setfill('0') << inst_byte_offset;
    comments.flags(saved_flags);
    comments.fill(saved_fill);
    ResetColor(comments);
    comment_separator = ", ";
  }

  if (comment_ && opcode == spv::Op::OpName) {
    const spv_parsed_operand_t& operand = inst.operands[0];
    const uint32_t word = inst.words[operand.offset];
    comments << comment_separator << "id %" << word;
    comment_separator = ", ";
  }

  if (comment_ && inst.result_id && id_comments_.count(inst.result_id) > 0) {
    comments << comment_separator << id_comments_[inst.result_id].str();
    comment_separator = ", ";
  }

  stream_ << line.str();

  if (!comments.str().empty()) {
    // Align the comments
    const uint32_t line_length = GetLineLengthWithoutColor(line.str());
    uint32_t align = std::max(
        {line_length + 2, last_instruction_comment_alignment_, kCommentColumn});
    // Round up the alignment to a multiple of 4 for more niceness.
    align = (align + 3) & ~0x3u;
    last_instruction_comment_alignment_ = align;

    stream_ << std::string(align - line_length, ' ') << "; " << comments.str();
  } else {
    last_instruction_comment_alignment_ = 0;
  }

  stream_ << "\n";
}